

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::GetIDType(SQLexer *this,SQChar *s,SQInteger len)

{
  SQUnsignedInteger *pSVar1;
  int iVar2;
  ulong uVar3;
  SQObjectValue SVar4;
  ulong uVar5;
  _HashNode *p_Var6;
  SQObjectValue *pSVar7;
  SQObjectPtr t;
  SQObjectPtr local_20;
  
  local_20.super_SQObject._type = OT_NULL;
  local_20.super_SQObject._unVal.pTable = (SQTable *)0x0;
  if (len == 0) {
    len = 0;
  }
  else {
    uVar5 = (ulong)len >> 5;
    uVar3 = len;
    do {
      len = len ^ (ulong)(ushort)(short)s[uVar3 - 1] + ((ulong)len >> 2) + len * 0x20;
      uVar3 = uVar3 + ~uVar5;
    } while (uVar5 < uVar3);
  }
  p_Var6 = this->_keywords->_nodes + (this->_keywords->_numofnodes - 1U & len);
  while (((p_Var6->key).super_SQObject._type != OT_STRING ||
         (iVar2 = strcmp((char *)&((p_Var6->key).super_SQObject._unVal.pOuter)->_idx,s), iVar2 != 0)
         )) {
    p_Var6 = p_Var6->next;
    if (p_Var6 == (_HashNode *)0x0) {
      SVar4.nInteger = 0x102;
LAB_00117a1c:
      SQObjectPtr::~SQObjectPtr(&local_20);
      return (SQInteger)SVar4.pTable;
    }
  }
  local_20.super_SQObject._type = (p_Var6->val).super_SQObject._type;
  pSVar7 = &(p_Var6->val).super_SQObject._unVal;
  if (local_20.super_SQObject._type == OT_WEAKREF) {
    local_20.super_SQObject._type = *(SQObjectType *)&pSVar7->pString->_sharedstate;
    pSVar7 = (SQObjectValue *)&pSVar7->pString->_next;
  }
  SVar4.pWeakRef = (SQWeakRef *)pSVar7->pTable;
  local_20.super_SQObject._unVal.pWeakRef = SVar4.pWeakRef;
  if ((local_20.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  goto LAB_00117a1c;
}

Assistant:

SQInteger SQLexer::GetIDType(const SQChar *s,SQInteger len)
{
    SQObjectPtr t;
    if(_keywords->GetStr(s,len, t)) {
        return SQInteger(_integer(t));
    }
    return TK_IDENTIFIER;
}